

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.h
# Opt level: O0

void __thiscall spsc_queue<int>::spsc_queue(spsc_queue<int> *this,size_t prealloc)

{
  undefined8 *puVar1;
  spsc_queue<int> *in_RSI;
  undefined8 *in_RDI;
  size_t i_1;
  size_t i;
  int dummy;
  node *n;
  spsc_queue<int> *v;
  spsc_queue<int> *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = 0;
  in_RDI[0xb] = puVar1;
  in_RDI[10] = puVar1;
  in_RDI[9] = puVar1;
  *in_RDI = puVar1;
  uVar2 = 0;
  for (this_00 = (spsc_queue<int> *)0x0; this_00 != in_RSI;
      this_00 = (spsc_queue<int> *)((long)&this_00->tail_ + 1)) {
    enqueue((spsc_queue<int> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
            (int)((ulong)this_00 >> 0x20));
  }
  for (v = (spsc_queue<int> *)0x0; v != in_RSI; v = (spsc_queue<int> *)((long)&v->tail_ + 1)) {
    try_dequeue(this_00,(int *)v);
  }
  return;
}

Assistant:

explicit spsc_queue(size_t prealloc)
  {
      node* n = new node;
      n->next_ = 0;
      tail_ = head_ = first_ = tail_copy_ = n;

      // [CD] Not (at all) the most efficient way to pre-allocate memory, but it works
      T dummy = T();
      for (size_t i = 0; i != prealloc; ++i) {
          enqueue(dummy);
      }
      for (size_t i = 0; i != prealloc; ++i) {
          try_dequeue(dummy);
      }
  }